

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall read_face::operator()(read_face *this,lw_face *face,xr_reader *r)

{
  uint32_t *puVar1;
  
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.v[0] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.ref[0] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.v[1] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.ref[1] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.v[2] = *puVar1;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  (face->field_0).field_0.ref[2] = *puVar1;
  return;
}

Assistant:

inline uint32_t xr_reader::r_u32() { return *m_p_u32++; }